

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::IEnumerable<int>>::Except<linq::IEnumerable<int>&>
          (IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
           *__return_storage_ptr__,void *this,IEnumerable<int> *other)

{
  anon_class_1_0_00000001_for_transformer f;
  anon_class_1_0_00000001_for_transformer local_89;
  ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
  local_88;
  
  ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::ExceptState(&local_88,(IEnumerable<int> *)this,other,&local_89);
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_88);
  local_88.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158858;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_88.filter._M_t);
  local_88.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_88.source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_88.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_88.source1.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.source1.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Except(O&& other)
		{
			using S2 = typename std::remove_reference<O>::type;
			using TS = typename std::remove_reference<T>::type;
			auto f = [](TS x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<ExceptState<S, S2, F, TS>>(ExceptState<S, S2, F, TS>(std::move(source), std::move(other), f));
		}